

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O3

void helper_vpermr_ppc(CPUPPCState_conflict *env,ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b,ppc_avr_t *c
                      )

{
  long lVar1;
  ppc_avr_t *ppVar2;
  bool bVar3;
  ppc_avr_t result;
  
  lVar1 = 0xf;
  do {
    ppVar2 = a;
    if ((c->u8[lVar1] & 0x10) == 0) {
      ppVar2 = b;
    }
    result.u8[lVar1] = ppVar2->u8[c->u8[lVar1] & 0xf];
    bVar3 = lVar1 != 0;
    lVar1 = lVar1 + -1;
  } while (bVar3);
  r->u64[0] = result.u64[0];
  r->u64[1] = result.u64[1];
  return;
}

Assistant:

void helper_vpermr(CPUPPCState *env, ppc_avr_t *r, ppc_avr_t *a, ppc_avr_t *b,
                  ppc_avr_t *c)
{
    ppc_avr_t result;
    int i;

    for (i = 0; i < ARRAY_SIZE(r->u8); i++) {
        int s = c->VsrB(i) & 0x1f;
        int index = 15 - (s & 0xf);

        if (s & 0x10) {
            result.VsrB(i) = a->VsrB(index);
        } else {
            result.VsrB(i) = b->VsrB(index);
        }
    }
    *r = result;
}